

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O0

int deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::getMaxSSBlockSize
              (NegativeTestContext *ctx,GLenum glShaderType)

{
  GLenum pname;
  GLint local_18;
  GLenum local_14;
  int maxSSBlocks;
  GLenum glShaderType_local;
  NegativeTestContext *ctx_local;
  
  local_18 = 0;
  local_14 = glShaderType;
  _maxSSBlocks = ctx;
  pname = getMaxSSBlockSizeEnum(glShaderType);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,pname,&local_18);
  return local_18;
}

Assistant:

int getMaxSSBlockSize (NegativeTestContext& ctx, glw::GLenum glShaderType)
{
	int maxSSBlocks = 0;
	ctx.glGetIntegerv(getMaxSSBlockSizeEnum(glShaderType), &maxSSBlocks);

	return maxSSBlocks;
}